

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabBarScrollToTab(ImGuiTabBar *tab_bar,ImGuiTabItem *tab)

{
  int iVar1;
  long in_RSI;
  int *in_RDI;
  float fVar2;
  float fVar3;
  float tab_x2;
  float tab_x1;
  int order;
  float margin;
  ImGuiContext *g;
  ImGuiTabItem *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  float local_38;
  float local_30;
  
  local_38 = GImGui->FontSize * 1.0;
  iVar1 = ImGuiTabBar::GetTabOrder
                    ((ImGuiTabBar *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
  if (iVar1 < 1) {
    local_30 = 0.0;
  }
  else {
    local_30 = -local_38;
  }
  local_30 = *(float *)(in_RSI + 0x1c) + local_30;
  if (*in_RDI <= iVar1 + 1) {
    local_38 = 1.0;
  }
  local_38 = *(float *)(in_RSI + 0x1c) + *(float *)(in_RSI + 0x20) + local_38;
  in_RDI[0x14] = 0;
  if ((local_30 < (float)in_RDI[0x13]) ||
     (fVar2 = ImRect::GetWidth((ImRect *)(in_RDI + 10)), fVar2 <= local_38 - local_30)) {
    fVar2 = ImMax<float>((float)in_RDI[0x12] - local_38,0.0);
    in_RDI[0x14] = (int)fVar2;
    in_RDI[0x13] = (int)local_30;
  }
  else {
    fVar2 = (float)in_RDI[0x13];
    fVar3 = ImRect::GetWidth((ImRect *)(in_RDI + 10));
    if (fVar2 < local_38 - fVar3) {
      fVar2 = ImRect::GetWidth((ImRect *)(in_RDI + 10));
      fVar2 = ImMax<float>((local_30 - fVar2) - (float)in_RDI[0x12],0.0);
      in_RDI[0x14] = (int)fVar2;
      fVar2 = ImRect::GetWidth((ImRect *)(in_RDI + 10));
      in_RDI[0x13] = (int)(local_38 - fVar2);
    }
  }
  return;
}

Assistant:

static void ImGui::TabBarScrollToTab(ImGuiTabBar* tab_bar, ImGuiTabItem* tab)
{
    ImGuiContext& g = *GImGui;
    float margin = g.FontSize * 1.0f; // When to scroll to make Tab N+1 visible always make a bit of N visible to suggest more scrolling area (since we don't have a scrollbar)
    int order = tab_bar->GetTabOrder(tab);
    float tab_x1 = tab->Offset + (order > 0 ? -margin : 0.0f);
    float tab_x2 = tab->Offset + tab->Width + (order + 1 < tab_bar->Tabs.Size ? margin : 1.0f);
    tab_bar->ScrollingTargetDistToVisibility = 0.0f;
    if (tab_bar->ScrollingTarget > tab_x1 || (tab_x2 - tab_x1 >= tab_bar->BarRect.GetWidth()))
    {
        tab_bar->ScrollingTargetDistToVisibility = ImMax(tab_bar->ScrollingAnim - tab_x2, 0.0f);
        tab_bar->ScrollingTarget = tab_x1;
    }
    else if (tab_bar->ScrollingTarget < tab_x2 - tab_bar->BarRect.GetWidth())
    {
        tab_bar->ScrollingTargetDistToVisibility = ImMax((tab_x1 - tab_bar->BarRect.GetWidth()) - tab_bar->ScrollingAnim, 0.0f);
        tab_bar->ScrollingTarget = tab_x2 - tab_bar->BarRect.GetWidth();
    }
}